

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaccessiblewidgets.cpp
# Opt level: O0

int __thiscall QAccessibleMainWindow::childCount(QAccessibleMainWindow *this)

{
  long lVar1;
  qsizetype qVar2;
  long in_FS_OFFSET;
  QList<QWidget_*> kids;
  QList<QWidget_*> local_28;
  QWidget *in_stack_fffffffffffffff0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_28.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_28.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_28.d.ptr = (QWidget **)&DAT_aaaaaaaaaaaaaaaa;
  mainWindow((QAccessibleMainWindow *)0x7e9080);
  _q_ac_childWidgets(in_stack_fffffffffffffff0);
  qVar2 = QList<QWidget_*>::size(&local_28);
  QList<QWidget_*>::~QList((QList<QWidget_*> *)0x7e90aa);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (int)qVar2;
  }
  __stack_chk_fail();
}

Assistant:

int QAccessibleMainWindow::childCount() const
{
    QList<QWidget*> kids = _q_ac_childWidgets(mainWindow());
    return kids.size();
}